

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgviz.hpp
# Opt level: O0

Vec3b __thiscall imgviz::getLabelColor(imgviz *this,uint8_t label)

{
  char cVar1;
  undefined8 local_20;
  size_t i;
  uint8_t b;
  uint8_t g;
  uint8_t r;
  uint8_t id;
  uint8_t label_local;
  
  i._5_1_ = 0;
  i._4_1_ = 0;
  i._3_1_ = 0;
  i._6_1_ = label;
  for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
    cVar1 = (char)local_20;
    i._5_1_ = i._5_1_ | ((i._6_1_ & 1) != 0) << (7U - cVar1 & 0x1f);
    i._4_1_ = i._4_1_ | ((i._6_1_ & 2) != 0) << (7U - cVar1 & 0x1f);
    i._3_1_ = i._3_1_ | ((i._6_1_ & 4) != 0) << (7U - cVar1 & 0x1f);
    i._6_1_ = (byte)((int)(uint)i._6_1_ >> 3);
  }
  cv::Vec<unsigned_char,_3>::Vec((Vec<unsigned_char,_3> *)this,i._3_1_,i._4_1_,i._5_1_);
  return (Vec3b)SUB83(this,0);
}

Assistant:

cv::Vec3b getLabelColor(const uint8_t label) {
  // VOC label colormap
  uint8_t id = label;
  uint8_t r = 0;
  uint8_t g = 0;
  uint8_t b = 0;
  for (size_t i = 0; i < 8; ++i) {
    r |= ((id & (1 << 0)) != 0) << (7 - i);
    g |= ((id & (1 << 1)) != 0) << (7 - i);
    b |= ((id & (1 << 2)) != 0) << (7 - i);
    id = id >> 3;
  }
  return cv::Vec3b(b, g, r);
}